

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

BrotliDecoderErrorCode SafeProcessCommands(BrotliDecoderStateInternal *s)

{
  uint32_t *puVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  ushort uVar6;
  byte *pbVar7;
  BackwardReferenceFromDecoder *pBVar8;
  BrotliDictionary *pBVar9;
  undefined8 uVar10;
  char cVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  HuffmanCode *pHVar15;
  ulong uVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  uint32_t uVar19;
  int iVar20;
  ulong uVar21;
  size_t sVar22;
  BrotliDecoderErrorCode BVar23;
  ulong uVar24;
  uint8_t *puVar25;
  uint uVar26;
  uint64_t uVar27;
  uint64_t uVar28;
  BrotliBitReader *pBVar29;
  uint64_t in_R11;
  uint uVar30;
  ulong uVar31;
  uint uVar32;
  BrotliDecoderErrorCode BVar33;
  bool bVar34;
  uint32_t cmd_code;
  ulong local_88;
  uint local_7c;
  BrotliBitReader *local_78;
  BrotliDecoderErrorCode local_6c;
  uint64_t local_68;
  uint local_60;
  uint local_5c;
  uint *local_58;
  uint8_t *local_50;
  uint *local_48;
  uint *local_40;
  size_t local_38;
  
  if (s->state - BROTLI_STATE_COMMAND_BEGIN < 4) {
    uVar13 = s->pos;
    local_88 = (ulong)uVar13;
    uVar30 = s->loop_counter;
    uVar16 = (ulong)uVar30;
    pBVar29 = &s->br;
    BVar23 = BROTLI_DECODER_SUCCESS;
    local_48 = &switchD_00104f3b::switchdataD_00108194;
    local_40 = &switchD_00104f3b::switchdataD_00108194;
    local_58 = &switchD_00104f3b::switchdataD_00108194;
    local_78 = pBVar29;
    switch(s->state) {
    case BROTLI_STATE_COMMAND_INNER:
      goto switchD_00104f3b_caseD_8;
    case BROTLI_STATE_COMMAND_POST_DECODE_LITERALS:
      goto switchD_00104f3b_caseD_9;
    case BROTLI_STATE_COMMAND_POST_WRAP_COPY:
      goto switchD_00104f3b_caseD_a;
    }
    do {
      uVar30 = (uint)uVar16;
      while (s->state = BROTLI_STATE_COMMAND_BEGIN, s->block_length[1] == 0) {
        iVar12 = SafeDecodeCommandBlockSwitch(s,(int)local_88);
        pBVar29 = local_78;
        if (iVar12 == 0) goto LAB_00105c6d;
      }
      local_68 = (s->br).val_;
      uVar18 = (s->br).bit_pos_;
      local_50 = (s->br).next_in;
      local_38 = (s->br).avail_in;
      pHVar15 = s->htree_command;
      bVar34 = uVar18 - 0x32 < 0xf;
      uVar17 = uVar18;
      if (bVar34) {
        sVar22 = (s->br).avail_in;
        if (sVar22 != 0) {
          uVar27 = (s->br).val_;
          pbVar7 = (s->br).next_in;
          uVar19 = uVar18;
          do {
            uVar17 = uVar19 - 8;
            sVar22 = sVar22 - 1;
            (s->br).val_ = uVar27 >> 8;
            uVar27 = (ulong)*pbVar7 << 0x38 | uVar27 >> 8;
            (s->br).val_ = uVar27;
            (s->br).bit_pos_ = uVar17;
            (s->br).avail_in = sVar22;
            (s->br).next_in = pbVar7 + 1;
            bVar34 = uVar19 - 0x3a < 0xf;
            if (!bVar34) goto LAB_00105015;
            pbVar7 = pbVar7 + 1;
            uVar19 = uVar17;
          } while (sVar22 != 0);
        }
      }
      else {
LAB_00105015:
        local_48 = (uint *)(ulong)((uint)(pBVar29->val_ >> ((byte)uVar17 & 0x3f)) & 0x7fff);
      }
      if (bVar34) {
        iVar12 = SafeDecodeSymbol(pHVar15,pBVar29,&local_7c);
        bVar34 = true;
        pBVar29 = local_78;
        if (iVar12 != 0) goto LAB_0010506b;
      }
      else {
        pHVar15 = pHVar15 + ((ulong)local_48 & 0xff);
        bVar2 = pHVar15->bits;
        if (8 < bVar2) {
          puVar1 = &(s->br).bit_pos_;
          *puVar1 = *puVar1 + 8;
          pHVar15 = pHVar15 + (((uint)((ulong)local_48 >> 8) & 0xffffff & kBitMask[bVar2 - 8]) +
                              (uint)pHVar15->value);
        }
        puVar1 = &(s->br).bit_pos_;
        *puVar1 = *puVar1 + (uint)pHVar15->bits;
        local_7c = (uint)pHVar15->value;
LAB_0010506b:
        uVar21 = (ulong)local_7c;
        bVar2 = kCmdLut[uVar21].insert_len_extra_bits;
        uVar13 = 0;
        bVar3 = kCmdLut[uVar21].copy_len_extra_bits;
        bVar4 = kCmdLut[uVar21].context;
        uVar5 = kCmdLut[uVar21].insert_len_offset;
        uVar16 = (ulong)uVar5;
        uVar6 = kCmdLut[uVar21].copy_len_offset;
        s->distance_code = (int)kCmdLut[uVar21].distance_code;
        s->distance_context = (uint)bVar4;
        s->dist_htree_index = s->dist_context_map_slice[bVar4];
        if (bVar2 != 0) {
          uVar17 = (s->br).bit_pos_;
          uVar26 = 0x40 - uVar17;
          uVar30 = (uint)bVar2;
          if (uVar26 < uVar30) {
            sVar22 = (s->br).avail_in;
            do {
              sVar22 = sVar22 - 1;
              if (sVar22 == 0xffffffffffffffff) {
                bVar34 = true;
                goto LAB_00105142;
              }
              uVar21 = (s->br).val_;
              pbVar7 = (s->br).next_in;
              (s->br).val_ = uVar21 >> 8;
              (s->br).val_ = (ulong)*pbVar7 << 0x38 | uVar21 >> 8;
              uVar17 = uVar17 - 8;
              (s->br).bit_pos_ = uVar17;
              (s->br).avail_in = sVar22;
              (s->br).next_in = pbVar7 + 1;
              uVar26 = uVar26 + 8;
              pBVar29 = local_78;
            } while (uVar26 < uVar30);
          }
          uVar13 = (uint)((s->br).val_ >> ((byte)uVar17 & 0x3f)) & kBitMask[uVar30];
          (s->br).bit_pos_ = uVar17 + uVar30;
        }
        bVar34 = false;
LAB_00105142:
        if (!bVar34) {
          bVar34 = false;
          uVar30 = 0;
          if (bVar3 != 0) {
            uVar17 = (s->br).bit_pos_;
            uVar26 = 0x40 - uVar17;
            uVar30 = (uint)bVar3;
            if (uVar26 < uVar30) {
              sVar22 = (s->br).avail_in;
              do {
                sVar22 = sVar22 - 1;
                if (sVar22 == 0xffffffffffffffff) {
                  bVar34 = true;
                  uVar30 = local_60;
                  goto LAB_001051e9;
                }
                uVar21 = (s->br).val_;
                pbVar7 = (s->br).next_in;
                (s->br).val_ = uVar21 >> 8;
                (s->br).val_ = (ulong)*pbVar7 << 0x38 | uVar21 >> 8;
                uVar17 = uVar17 - 8;
                (s->br).bit_pos_ = uVar17;
                (s->br).avail_in = sVar22;
                (s->br).next_in = pbVar7 + 1;
                uVar26 = uVar26 + 8;
                pBVar29 = local_78;
              } while (uVar26 < uVar30);
            }
            uVar26 = kBitMask[uVar30];
            (s->br).bit_pos_ = uVar17 + uVar30;
            bVar34 = false;
            uVar30 = (uint)((s->br).val_ >> ((byte)uVar17 & 0x3f)) & uVar26;
          }
LAB_001051e9:
          local_60 = uVar30;
          if (!bVar34) {
            s->copy_length = uVar6 + local_60;
            s->block_length[1] = s->block_length[1] - 1;
            bVar34 = false;
            uVar16 = (ulong)(uVar13 + uVar5);
            goto LAB_00105230;
          }
        }
        (s->br).val_ = local_68;
        (s->br).bit_pos_ = uVar18;
        (s->br).next_in = local_50;
        (s->br).avail_in = local_38;
        bVar34 = true;
      }
LAB_00105230:
      uVar30 = (uint)uVar16;
      if (bVar34) {
LAB_00105c6d:
        BVar23 = BROTLI_DECODER_NEEDS_MORE_INPUT;
        goto LAB_001057d5;
      }
      if ((s->field_0x338 & 0x40) != 0) {
        s->commands[s->commands_size].copy_len = s->copy_length;
      }
      if (uVar30 != 0) {
        s->meta_block_remaining_len = s->meta_block_remaining_len - uVar30;
switchD_00104f3b_caseD_8:
        BVar33 = BVar23;
        do {
          while( true ) {
            s->state = BROTLI_STATE_COMMAND_INNER;
            iVar12 = (int)local_88;
            if (s->trivial_literal_context != 0) break;
            uVar31 = (ulong)s->ringbuffer[(int)(iVar12 - 2U & s->ringbuffer_mask)];
            uVar21 = (ulong)s->ringbuffer[(int)(iVar12 - 1U & s->ringbuffer_mask)];
            BVar23 = BVar33;
            do {
              iVar12 = (int)local_88;
              if (s->block_length[0] == 0) {
                iVar20 = SafeDecodeLiteralBlockSwitch(s,iVar12);
                uVar24 = uVar21;
                pBVar29 = local_78;
                if (iVar20 == 0) {
                  cVar11 = '\x02';
                  BVar23 = BROTLI_DECODER_NEEDS_MORE_INPUT;
                }
                else {
                  cVar11 = '\x04';
                  if (s->trivial_literal_context == 0) goto LAB_001052c7;
                }
              }
              else {
LAB_001052c7:
                pHVar15 = (s->literal_hgroup).htrees
                          [s->context_map_slice
                           [s->context_lookup[(uVar31 & 0xff) + 0x100] |
                            s->context_lookup[uVar21 & 0xff]]];
                uVar18 = (s->br).bit_pos_;
                bVar34 = uVar18 - 0x32 < 0xf;
                if (bVar34) {
                  sVar22 = (s->br).avail_in;
                  if (sVar22 != 0) {
                    uVar27 = (s->br).val_;
                    pbVar7 = (s->br).next_in;
                    uVar17 = uVar18;
                    do {
                      uVar18 = uVar17 - 8;
                      sVar22 = sVar22 - 1;
                      (s->br).val_ = uVar27 >> 8;
                      uVar27 = (ulong)*pbVar7 << 0x38 | uVar27 >> 8;
                      (s->br).val_ = uVar27;
                      (s->br).bit_pos_ = uVar18;
                      (s->br).avail_in = sVar22;
                      (s->br).next_in = pbVar7 + 1;
                      bVar34 = uVar17 - 0x3a < 0xf;
                      if (!bVar34) goto LAB_0010536b;
                      pbVar7 = pbVar7 + 1;
                      uVar17 = uVar18;
                    } while (sVar22 != 0);
                  }
                }
                else {
LAB_0010536b:
                  in_R11 = (uint64_t)((uint)(pBVar29->val_ >> ((byte)uVar18 & 0x3f)) & 0x7fff);
                }
                if (bVar34) {
                  iVar20 = SafeDecodeSymbol(pHVar15,pBVar29,&local_7c);
                  bVar34 = iVar20 == 0;
                  pBVar29 = local_78;
                }
                else {
                  pHVar15 = pHVar15 + (in_R11 & 0xff);
                  bVar2 = pHVar15->bits;
                  if (8 < bVar2) {
                    puVar1 = &(s->br).bit_pos_;
                    *puVar1 = *puVar1 + 8;
                    pHVar15 = pHVar15 + (((uint)(in_R11 >> 8) & 0xffffff & kBitMask[bVar2 - 8]) +
                                        (uint)pHVar15->value);
                  }
                  puVar1 = &(s->br).bit_pos_;
                  *puVar1 = *puVar1 + (uint)pHVar15->bits;
                  local_7c = (uint)pHVar15->value;
                  bVar34 = false;
                }
                if (bVar34 == false) {
                  s->ringbuffer[iVar12] = (uint8_t)local_7c;
                  s->block_length[0] = s->block_length[0] - 1;
                  local_88 = (ulong)(iVar12 + 1U);
                  cVar11 = '\0';
                  uVar13 = local_7c;
                  if (iVar12 + 1U == s->ringbuffer_size) {
                    s->state = BROTLI_STATE_COMMAND_INNER_WRITE;
                    uVar16 = (ulong)((int)uVar16 - 1);
                    cVar11 = '\x02';
                  }
                }
                else {
                  BVar23 = BROTLI_DECODER_NEEDS_MORE_INPUT;
                  cVar11 = bVar34 * '\x02';
                  uVar13 = (uint)(uVar21 & 0xff);
                }
                uVar24 = (ulong)uVar13;
                uVar31 = uVar21;
              }
              if (cVar11 != '\0') goto LAB_001054c0;
              uVar13 = (int)uVar16 - 1;
              uVar16 = (ulong)uVar13;
              uVar21 = uVar24;
            } while (uVar13 != 0);
            cVar11 = '\0';
LAB_001054c0:
            uVar30 = (uint)uVar16;
            BVar33 = BVar23;
            if (cVar11 != '\x04') {
              if (cVar11 == '\x02') goto LAB_001057d5;
              if (cVar11 != '\0') {
                return local_6c;
              }
              goto LAB_001056ca;
            }
          }
          local_88 = (ulong)iVar12;
          iVar20 = (int)uVar16;
          do {
            if (s->block_length[0] == 0) {
              iVar14 = SafeDecodeLiteralBlockSwitch(s,(int)local_88);
              pBVar29 = local_78;
              if (iVar14 == 0) {
                iVar14 = 2;
                BVar23 = BROTLI_DECODER_NEEDS_MORE_INPUT;
                goto LAB_0010567d;
              }
              if (s->trivial_literal_context == 0) {
                iVar14 = 4;
                BVar23 = BVar33;
                goto LAB_0010567d;
              }
            }
            uVar18 = (s->br).bit_pos_;
            bVar34 = uVar18 - 0x32 < 0xf;
            if (bVar34) {
              sVar22 = (s->br).avail_in;
              if (sVar22 != 0) {
                uVar27 = (s->br).val_;
                pbVar7 = (s->br).next_in;
                uVar17 = uVar18;
                do {
                  uVar18 = uVar17 - 8;
                  sVar22 = sVar22 - 1;
                  (s->br).val_ = uVar27 >> 8;
                  uVar27 = (ulong)*pbVar7 << 0x38 | uVar27 >> 8;
                  (s->br).val_ = uVar27;
                  (s->br).bit_pos_ = uVar18;
                  (s->br).avail_in = sVar22;
                  (s->br).next_in = pbVar7 + 1;
                  bVar34 = uVar17 - 0x3a < 0xf;
                  if (!bVar34) goto LAB_00105552;
                  pbVar7 = pbVar7 + 1;
                  uVar17 = uVar18;
                } while (sVar22 != 0);
              }
            }
            else {
LAB_00105552:
              local_40 = (uint *)(ulong)((uint)(pBVar29->val_ >> ((byte)uVar18 & 0x3f)) & 0x7fff);
            }
            if (bVar34) {
              iVar14 = SafeDecodeSymbol(s->literal_htree,pBVar29,&local_7c);
              bVar34 = iVar14 == 0;
              pBVar29 = local_78;
            }
            else {
              pHVar15 = s->literal_htree + ((ulong)local_40 & 0xff);
              bVar2 = pHVar15->bits;
              if (8 < bVar2) {
                puVar1 = &(s->br).bit_pos_;
                *puVar1 = *puVar1 + 8;
                pHVar15 = pHVar15 + (((uint)((ulong)local_40 >> 8) & 0xffffff & kBitMask[bVar2 - 8])
                                    + (uint)pHVar15->value);
              }
              puVar1 = &(s->br).bit_pos_;
              *puVar1 = *puVar1 + (uint)pHVar15->bits;
              local_7c = (uint)pHVar15->value;
              bVar34 = false;
            }
            iVar14 = 2;
            BVar23 = BROTLI_DECODER_NEEDS_MORE_INPUT;
            if (bVar34) goto LAB_0010567d;
            s->ringbuffer[local_88] = (uint8_t)local_7c;
            s->block_length[0] = s->block_length[0] - 1;
            local_88 = local_88 + 1;
            if (s->ringbuffer_size == (int)local_88) {
              s->state = BROTLI_STATE_COMMAND_INNER_WRITE;
              uVar16 = (ulong)((int)uVar16 - 1);
              iVar14 = 2;
              BVar23 = BVar33;
              goto LAB_0010567d;
            }
            uVar13 = (int)uVar16 - 1;
            uVar16 = (ulong)uVar13;
          } while (uVar13 != 0);
          uVar16 = 0;
          iVar14 = 0;
          BVar23 = BVar33;
          local_88 = (ulong)(uint)(iVar12 + iVar20);
LAB_0010567d:
          uVar30 = (uint)uVar16;
          BVar33 = BVar23;
        } while (iVar14 == 4);
        if (iVar14 != 0) {
joined_r0x001059ad:
          if (iVar14 != 2) {
            return local_6c;
          }
          goto LAB_001057d5;
        }
LAB_001056ca:
        if (0 < s->meta_block_remaining_len) goto switchD_00104f3b_caseD_9;
        break;
      }
switchD_00104f3b_caseD_9:
      s->state = BROTLI_STATE_COMMAND_POST_DECODE_LITERALS;
      local_68 = in_R11;
      if (s->distance_code < 0) {
        if ((s->block_length[2] == 0) &&
           (iVar12 = SafeDecodeDistanceBlockSwitch(s), pBVar29 = local_78, iVar12 == 0)) {
          BVar23 = BROTLI_DECODER_NEEDS_MORE_INPUT;
          goto LAB_001057d5;
        }
        pHVar15 = (s->distance_hgroup).htrees[s->dist_htree_index];
        uVar27 = (s->br).val_;
        uVar18 = (s->br).bit_pos_;
        puVar25 = (s->br).next_in;
        local_50 = (uint8_t *)(s->br).avail_in;
        bVar34 = uVar18 - 0x32 < 0xf;
        uVar17 = uVar18;
        if (bVar34) {
          sVar22 = (s->br).avail_in;
          if (sVar22 != 0) {
            uVar28 = (s->br).val_;
            pbVar7 = (s->br).next_in;
            uVar19 = uVar18;
            do {
              uVar17 = uVar19 - 8;
              sVar22 = sVar22 - 1;
              (s->br).val_ = uVar28 >> 8;
              uVar28 = (ulong)*pbVar7 << 0x38 | uVar28 >> 8;
              (s->br).val_ = uVar28;
              (s->br).bit_pos_ = uVar17;
              (s->br).avail_in = sVar22;
              (s->br).next_in = pbVar7 + 1;
              bVar34 = uVar19 - 0x3a < 0xf;
              if (!bVar34) goto LAB_001057fa;
              pbVar7 = pbVar7 + 1;
              uVar19 = uVar17;
            } while (sVar22 != 0);
          }
        }
        else {
LAB_001057fa:
          local_58 = (uint *)(ulong)((uint)(pBVar29->val_ >> ((byte)uVar17 & 0x3f)) & 0x7fff);
        }
        if (bVar34) {
          iVar12 = SafeDecodeSymbol(pHVar15,pBVar29,&local_7c);
          bVar34 = true;
          pBVar29 = local_78;
          if (iVar12 != 0) goto LAB_00105850;
        }
        else {
          pHVar15 = pHVar15 + ((ulong)local_58 & 0xff);
          bVar2 = pHVar15->bits;
          if (8 < bVar2) {
            puVar1 = &(s->br).bit_pos_;
            *puVar1 = *puVar1 + 8;
            pHVar15 = pHVar15 + (((uint)((ulong)local_58 >> 8) & 0xffffff & kBitMask[bVar2 - 8]) +
                                (uint)pHVar15->value);
          }
          puVar1 = &(s->br).bit_pos_;
          *puVar1 = *puVar1 + (uint)pHVar15->bits;
          local_7c = (uint)pHVar15->value;
LAB_00105850:
          uVar17 = s->block_length[2];
          s->block_length[2] = uVar17 - 1;
          s->distance_context = 0;
          uVar16 = (ulong)local_7c;
          if (uVar16 < 0x10) {
            s->distance_code = local_7c;
            if ((int)local_7c < 4) {
              uVar13 = 1 >> ((byte)local_7c & 0x1f);
              s->distance_context = uVar13;
              s->distance_code = s->dist_rb[~local_7c + s->dist_rb_idx & 3];
              s->dist_rb_idx = s->dist_rb_idx - uVar13;
            }
            else {
              iVar20 = local_7c - 4;
              iVar12 = 3;
              if (9 < (int)local_7c) {
                iVar20 = local_7c - 10;
                iVar12 = 10;
              }
              iVar20 = (0x605142U >> ((byte)(iVar20 << 2) & 0x1f) & 7) +
                       s->dist_rb[iVar12 + s->dist_rb_idx & 3] + -3;
              iVar12 = 0x7fffffff;
              if (0 < iVar20) {
                iVar12 = iVar20;
              }
              s->distance_code = iVar12;
            }
            bVar34 = false;
          }
          else {
            bVar2 = *(byte *)((long)s->trivial_literal_contexts + uVar16 + 0x20);
            bVar34 = false;
            uVar13 = 0;
            if (bVar2 != 0) {
              uVar19 = (s->br).bit_pos_;
              uVar26 = 0x40 - uVar19;
              uVar13 = (uint)bVar2;
              if (uVar26 < uVar13) {
                sVar22 = (s->br).avail_in;
                do {
                  sVar22 = sVar22 - 1;
                  if (sVar22 == 0xffffffffffffffff) {
                    bVar34 = true;
                    uVar13 = local_5c;
                    goto LAB_001059c6;
                  }
                  uVar21 = (s->br).val_;
                  pbVar7 = (s->br).next_in;
                  (s->br).val_ = uVar21 >> 8;
                  (s->br).val_ = (ulong)*pbVar7 << 0x38 | uVar21 >> 8;
                  uVar19 = uVar19 - 8;
                  (s->br).bit_pos_ = uVar19;
                  (s->br).avail_in = sVar22;
                  (s->br).next_in = pbVar7 + 1;
                  uVar26 = uVar26 + 8;
                  pBVar29 = local_78;
                } while (uVar26 < uVar13);
              }
              uVar26 = kBitMask[uVar13];
              (s->br).bit_pos_ = uVar19 + uVar13;
              bVar34 = false;
              uVar13 = (uint)((s->br).val_ >> ((byte)uVar19 & 0x3f)) & uVar26;
            }
LAB_001059c6:
            if (!bVar34) {
              s->distance_code =
                   (uVar13 << ((byte)s->distance_postfix_bits & 0x1f)) +
                   *(int *)((long)&s->arena + uVar16 * 4 + 0x220);
            }
            else {
              s->block_length[2] = uVar17;
              (s->br).val_ = uVar27;
              (s->br).bit_pos_ = uVar18;
              (s->br).next_in = puVar25;
              (s->br).avail_in = (size_t)local_50;
            }
            bVar34 = bVar34;
            local_5c = uVar13;
          }
        }
        if (bVar34) goto LAB_00105c6d;
      }
      else {
        s->distance_context = (uint)(s->distance_code == 0);
        uVar13 = s->dist_rb_idx - 1;
        s->dist_rb_idx = uVar13;
        s->distance_code = s->dist_rb[uVar13 & 3];
      }
      iVar12 = s->max_backward_distance;
      if (s->max_distance != iVar12) {
        if ((int)local_88 < iVar12) {
          iVar12 = (int)local_88;
        }
        s->max_distance = iVar12;
      }
      if ((s->field_0x338 & 0x40) != 0) {
        pBVar8 = s->commands;
        sVar22 = s->commands_size;
        pBVar8[sVar22].distance = s->distance_code;
        pBVar8[sVar22].position = (int)local_88;
        pBVar8[sVar22].max_distance = s->max_distance;
        s->commands_size = sVar22 + 1;
      }
      uVar30 = s->copy_length;
      uVar16 = (ulong)uVar30;
      iVar12 = s->distance_code;
      if (s->max_distance < iVar12) {
        if (0x7ffffffc < iVar12) {
          return BROTLI_DECODER_ERROR_FORMAT_DISTANCE;
        }
        if (0x14 < uVar30 - 4) {
          return BROTLI_DECODER_ERROR_FORMAT_DICTIONARY;
        }
        uVar26 = iVar12 + ~s->max_distance;
        pBVar9 = s->dictionary;
        uVar18 = pBVar9->offsets_by_length[uVar16];
        uVar13 = kBitMask[pBVar9->size_bits_by_length[uVar16]];
        iVar12 = (int)uVar26 >> (pBVar9->size_bits_by_length[uVar16] & 0x1f);
        s->dist_rb_idx = s->dist_rb_idx + s->distance_context;
        iVar14 = 1;
        if (pBVar9->data == (uint8_t *)0x0) {
          local_6c = BROTLI_DECODER_ERROR_DICTIONARY_NOT_SET;
        }
        else if (iVar12 < (int)s->transforms->num_transforms) {
          puVar25 = pBVar9->data + (long)(int)((uVar13 & uVar26) * uVar30) + (long)(int)uVar18;
          if (iVar12 == s->transforms->cutOffTransforms[0]) {
            memcpy(s->ringbuffer + (int)local_88,puVar25,uVar16);
            uVar13 = uVar30;
          }
          else {
            uVar13 = BrotliTransformDictionaryWord(s->ringbuffer + (int)local_88,puVar25,uVar30);
          }
          s->meta_block_remaining_len = s->meta_block_remaining_len - uVar13;
          uVar13 = (int)local_88 + uVar13;
          local_88 = (ulong)uVar13;
          iVar14 = 0;
          pBVar29 = local_78;
          if (s->ringbuffer_size <= (int)uVar13) {
            s->state = BROTLI_STATE_COMMAND_POST_WRITE_1;
            iVar14 = 2;
          }
        }
        else {
          local_6c = BROTLI_DECODER_ERROR_FORMAT_TRANSFORM;
        }
        in_R11 = local_68;
        if (iVar14 != 0) goto joined_r0x001059ad;
      }
      else {
        uVar26 = (int)local_88 - iVar12 & s->ringbuffer_mask;
        puVar25 = s->ringbuffer;
        uVar32 = uVar30 + (int)local_88;
        uVar13 = s->dist_rb_idx;
        s->dist_rb[uVar13 & 3] = iVar12;
        s->dist_rb_idx = uVar13 + 1;
        s->meta_block_remaining_len = s->meta_block_remaining_len - uVar30;
        uVar10 = *(undefined8 *)(puVar25 + (int)uVar26 + 8);
        *(undefined8 *)(puVar25 + (int)local_88) = *(undefined8 *)(puVar25 + (int)uVar26);
        *(undefined8 *)(puVar25 + (int)local_88 + 8) = uVar10;
        iVar12 = 6;
        if (((((int)(uVar26 + uVar30) <= (int)local_88) || ((int)uVar32 <= (int)uVar26)) &&
            ((int)uVar32 < s->ringbuffer_size)) && ((int)(uVar26 + uVar30) < s->ringbuffer_size)) {
          iVar12 = 0;
          if (0x10 < (int)uVar30) {
            if ((int)uVar30 < 0x21) {
              uVar10 = *(undefined8 *)(puVar25 + (long)(int)uVar26 + 0x18);
              *(undefined8 *)(puVar25 + (long)(int)local_88 + 0x10) =
                   *(undefined8 *)(puVar25 + (long)(int)uVar26 + 0x10);
              *(undefined8 *)(puVar25 + (long)(int)local_88 + 0x18) = uVar10;
            }
            else {
              memcpy(puVar25 + (long)(int)local_88 + 0x10,puVar25 + (long)(int)uVar26 + 0x10,
                     (ulong)(uVar30 - 0x10));
            }
          }
          local_88 = (ulong)uVar32;
        }
        uVar13 = (uint)local_88;
        in_R11 = local_68;
        if (iVar12 == 6) {
switchD_00104f3b_caseD_a:
          iVar12 = s->ringbuffer_size;
          local_88 = (ulong)(int)uVar13;
          do {
            iVar20 = (int)uVar16;
            if (iVar20 < 1) goto LAB_00105cda;
            s->ringbuffer[local_88] =
                 s->ringbuffer[(int)local_88 - s->distance_code & s->ringbuffer_mask];
            local_88 = local_88 + 1;
            uVar16 = (ulong)(iVar20 - 1);
          } while (iVar12 != (int)local_88);
          s->state = BROTLI_STATE_COMMAND_POST_WRITE_2;
LAB_00105cda:
          uVar30 = iVar20 - 1;
          uVar16 = (ulong)uVar30;
          pBVar29 = local_78;
          if (0 < iVar20) goto LAB_001057d5;
        }
        else {
          pBVar29 = local_78;
          if (iVar12 != 0) {
            return local_6c;
          }
        }
      }
      uVar30 = (uint)uVar16;
    } while (0 < s->meta_block_remaining_len);
    s->state = BROTLI_STATE_METABLOCK_DONE;
LAB_001057d5:
    s->pos = (int)local_88;
    s->loop_counter = uVar30;
    local_6c = BVar23;
  }
  else {
    local_6c = BROTLI_DECODER_ERROR_UNREACHABLE;
  }
  return local_6c;
}

Assistant:

static BROTLI_INLINE BrotliDecoderErrorCode ProcessCommandsInternal(
    int safe, BrotliDecoderState* s) {
  int pos = s->pos;
  int i = s->loop_counter;
  BrotliDecoderErrorCode result = BROTLI_DECODER_SUCCESS;
  BrotliBitReader* br = &s->br;
  if (!CheckInputAmount(safe, br, 28)) {
    result = BROTLI_DECODER_NEEDS_MORE_INPUT;
    goto saveStateAndReturn;
  }
  if (!safe) {
    BROTLI_UNUSED(BrotliWarmupBitReader(br));
  }

  /* Jump into state machine. */
  if (s->state == BROTLI_STATE_COMMAND_BEGIN) {
    goto CommandBegin;
  } else if (s->state == BROTLI_STATE_COMMAND_INNER) {
    goto CommandInner;
  } else if (s->state == BROTLI_STATE_COMMAND_POST_DECODE_LITERALS) {
    goto CommandPostDecodeLiterals;
  } else if (s->state == BROTLI_STATE_COMMAND_POST_WRAP_COPY) {
    goto CommandPostWrapCopy;
  } else {
    return BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE);
  }

CommandBegin:
  if (safe) {
    s->state = BROTLI_STATE_COMMAND_BEGIN;
  }
  if (!CheckInputAmount(safe, br, 28)) {  /* 156 bits + 7 bytes */
    s->state = BROTLI_STATE_COMMAND_BEGIN;
    result = BROTLI_DECODER_NEEDS_MORE_INPUT;
    goto saveStateAndReturn;
  }
  if (BROTLI_PREDICT_FALSE(s->block_length[1] == 0)) {
    BROTLI_SAFE(DecodeCommandBlockSwitch(s, pos));
    goto CommandBegin;
  }
  /* Read the insert/copy length in the command. */
  BROTLI_SAFE(ReadCommand(s, br, &i));
  BROTLI_LOG(("[ProcessCommandsInternal] pos = %d insert = %d copy = %d\n",
              pos, i, s->copy_length));
  /* Save backward reference info if needed */
  if (s->save_info_for_recompression) {
    s->commands[s->commands_size].copy_len = s->copy_length;
  }
  if (i == 0) {
    goto CommandPostDecodeLiterals;
  }
  s->meta_block_remaining_len -= i;

CommandInner:
  if (safe) {
    s->state = BROTLI_STATE_COMMAND_INNER;
  }
  /* Read the literals in the command. */
  if (s->trivial_literal_context) {
    uint32_t bits;
    uint32_t value;
    PreloadSymbol(safe, s->literal_htree, br, &bits, &value);
    do {
      if (!CheckInputAmount(safe, br, 28)) {  /* 162 bits + 7 bytes */
        s->state = BROTLI_STATE_COMMAND_INNER;
        result = BROTLI_DECODER_NEEDS_MORE_INPUT;
        goto saveStateAndReturn;
      }
      if (BROTLI_PREDICT_FALSE(s->block_length[0] == 0)) {
        BROTLI_SAFE(DecodeLiteralBlockSwitch(s, pos));
        PreloadSymbol(safe, s->literal_htree, br, &bits, &value);
        if (!s->trivial_literal_context) goto CommandInner;
      }
      if (!safe) {
        s->ringbuffer[pos] =
            (uint8_t)ReadPreloadedSymbol(s->literal_htree, br, &bits, &value);
      } else {
        uint32_t literal;
        if (!SafeReadSymbol(s->literal_htree, br, &literal)) {
          result = BROTLI_DECODER_NEEDS_MORE_INPUT;
          goto saveStateAndReturn;
        }
        s->ringbuffer[pos] = (uint8_t)literal;
      }
      --s->block_length[0];
      BROTLI_LOG_ARRAY_INDEX(s->ringbuffer, pos);
      ++pos;
      if (BROTLI_PREDICT_FALSE(pos == s->ringbuffer_size)) {
        s->state = BROTLI_STATE_COMMAND_INNER_WRITE;
        --i;
        goto saveStateAndReturn;
      }
    } while (--i != 0);
  } else {
    uint8_t p1 = s->ringbuffer[(pos - 1) & s->ringbuffer_mask];
    uint8_t p2 = s->ringbuffer[(pos - 2) & s->ringbuffer_mask];
    do {
      const HuffmanCode* hc;
      uint8_t context;
      if (!CheckInputAmount(safe, br, 28)) {  /* 162 bits + 7 bytes */
        s->state = BROTLI_STATE_COMMAND_INNER;
        result = BROTLI_DECODER_NEEDS_MORE_INPUT;
        goto saveStateAndReturn;
      }
      if (BROTLI_PREDICT_FALSE(s->block_length[0] == 0)) {
        BROTLI_SAFE(DecodeLiteralBlockSwitch(s, pos));
        if (s->trivial_literal_context) goto CommandInner;
      }
      context = BROTLI_CONTEXT(p1, p2, s->context_lookup);
      BROTLI_LOG_UINT(context);
      hc = s->literal_hgroup.htrees[s->context_map_slice[context]];
      p2 = p1;
      if (!safe) {
        p1 = (uint8_t)ReadSymbol(hc, br);
      } else {
        uint32_t literal;
        if (!SafeReadSymbol(hc, br, &literal)) {
          result = BROTLI_DECODER_NEEDS_MORE_INPUT;
          goto saveStateAndReturn;
        }
        p1 = (uint8_t)literal;
      }
      s->ringbuffer[pos] = p1;
      --s->block_length[0];
      BROTLI_LOG_UINT(s->context_map_slice[context]);
      BROTLI_LOG_ARRAY_INDEX(s->ringbuffer, pos & s->ringbuffer_mask);
      ++pos;
      if (BROTLI_PREDICT_FALSE(pos == s->ringbuffer_size)) {
        s->state = BROTLI_STATE_COMMAND_INNER_WRITE;
        --i;
        goto saveStateAndReturn;
      }
    } while (--i != 0);
  }
  BROTLI_LOG_UINT(s->meta_block_remaining_len);
  if (BROTLI_PREDICT_FALSE(s->meta_block_remaining_len <= 0)) {
    s->state = BROTLI_STATE_METABLOCK_DONE;
    goto saveStateAndReturn;
  }

CommandPostDecodeLiterals:
  if (safe) {
    s->state = BROTLI_STATE_COMMAND_POST_DECODE_LITERALS;
  }
  if (s->distance_code >= 0) {
    /* Implicit distance case. */
    s->distance_context = s->distance_code ? 0 : 1;
    --s->dist_rb_idx;
    s->distance_code = s->dist_rb[s->dist_rb_idx & 3];
  } else {
    /* Read distance code in the command, unless it was implicitly zero. */
    if (BROTLI_PREDICT_FALSE(s->block_length[2] == 0)) {
      BROTLI_SAFE(DecodeDistanceBlockSwitch(s));
    }
    BROTLI_SAFE(ReadDistance(s, br));
  }
  BROTLI_LOG(("[ProcessCommandsInternal] pos = %d distance = %d\n",
              pos, s->distance_code));
  if (s->max_distance != s->max_backward_distance) {
    s->max_distance =
        (pos < s->max_backward_distance) ? pos : s->max_backward_distance;
  }
  /* Save backward reference info if needed */
  if (s->save_info_for_recompression) {
    s->commands[s->commands_size].distance = s->distance_code;
    s->commands[s->commands_size].position = pos;
    s->commands[s->commands_size].max_distance = s->max_distance;
    ++s->commands_size;
  }
  i = s->copy_length;
  /* Apply copy of LZ77 back-reference, or static dictionary reference if
     the distance is larger than the max LZ77 distance */
  if (s->distance_code > s->max_distance) {
    /* The maximum allowed distance is BROTLI_MAX_ALLOWED_DISTANCE = 0x7FFFFFFC.
       With this choice, no signed overflow can occur after decoding
       a special distance code (e.g., after adding 3 to the last distance). */
    if (s->distance_code > BROTLI_MAX_ALLOWED_DISTANCE) {
      BROTLI_LOG(("Invalid backward reference. pos: %d distance: %d "
          "len: %d bytes left: %d\n",
          pos, s->distance_code, i, s->meta_block_remaining_len));
      return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_DISTANCE);
    }
    if (i >= BROTLI_MIN_DICTIONARY_WORD_LENGTH &&
        i <= BROTLI_MAX_DICTIONARY_WORD_LENGTH) {
      int address = s->distance_code - s->max_distance - 1;
      const BrotliDictionary* words = s->dictionary;
      const BrotliTransforms* transforms = s->transforms;
      int offset = (int)s->dictionary->offsets_by_length[i];
      uint32_t shift = s->dictionary->size_bits_by_length[i];

      int mask = (int)BitMask(shift);
      int word_idx = address & mask;
      int transform_idx = address >> shift;
      /* Compensate double distance-ring-buffer roll. */
      s->dist_rb_idx += s->distance_context;
      offset += word_idx * i;
      if (BROTLI_PREDICT_FALSE(!words->data)) {
        return BROTLI_FAILURE(BROTLI_DECODER_ERROR_DICTIONARY_NOT_SET);
      }
      if (transform_idx < (int)transforms->num_transforms) {
        const uint8_t* word = &words->data[offset];
        int len = i;
        if (transform_idx == transforms->cutOffTransforms[0]) {
          memcpy(&s->ringbuffer[pos], word, (size_t)len);
          BROTLI_LOG(("[ProcessCommandsInternal] dictionary word: [%.*s]\n",
                      len, word));
        } else {
          len = BrotliTransformDictionaryWord(&s->ringbuffer[pos], word, len,
              transforms, transform_idx);
          BROTLI_LOG(("[ProcessCommandsInternal] dictionary word: [%.*s],"
                      " transform_idx = %d, transformed: [%.*s]\n",
                      i, word, transform_idx, len, &s->ringbuffer[pos]));
        }
        pos += len;
        s->meta_block_remaining_len -= len;
        if (pos >= s->ringbuffer_size) {
          s->state = BROTLI_STATE_COMMAND_POST_WRITE_1;
          goto saveStateAndReturn;
        }
      } else {
        BROTLI_LOG(("Invalid backward reference. pos: %d distance: %d "
            "len: %d bytes left: %d\n",
            pos, s->distance_code, i, s->meta_block_remaining_len));
        return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_TRANSFORM);
      }
    } else {
      BROTLI_LOG(("Invalid backward reference. pos: %d distance: %d "
          "len: %d bytes left: %d\n",
          pos, s->distance_code, i, s->meta_block_remaining_len));
      return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_DICTIONARY);
    }
  } else {
    int src_start = (pos - s->distance_code) & s->ringbuffer_mask;
    uint8_t* copy_dst = &s->ringbuffer[pos];
    uint8_t* copy_src = &s->ringbuffer[src_start];
    int dst_end = pos + i;
    int src_end = src_start + i;
    /* Update the recent distances cache. */
    s->dist_rb[s->dist_rb_idx & 3] = s->distance_code;
    ++s->dist_rb_idx;
    s->meta_block_remaining_len -= i;
    /* There are 32+ bytes of slack in the ring-buffer allocation.
       Also, we have 16 short codes, that make these 16 bytes irrelevant
       in the ring-buffer. Let's copy over them as a first guess. */
    memmove16(copy_dst, copy_src);
    if (src_end > pos && dst_end > src_start) {
      /* Regions intersect. */
      goto CommandPostWrapCopy;
    }
    if (dst_end >= s->ringbuffer_size || src_end >= s->ringbuffer_size) {
      /* At least one region wraps. */
      goto CommandPostWrapCopy;
    }
    pos += i;
    if (i > 16) {
      if (i > 32) {
        memcpy(copy_dst + 16, copy_src + 16, (size_t)(i - 16));
      } else {
        /* This branch covers about 45% cases.
           Fixed size short copy allows more compiler optimizations. */
        memmove16(copy_dst + 16, copy_src + 16);
      }
    }
  }
  BROTLI_LOG_UINT(s->meta_block_remaining_len);
  if (s->meta_block_remaining_len <= 0) {
    /* Next metablock, if any. */
    s->state = BROTLI_STATE_METABLOCK_DONE;
    goto saveStateAndReturn;
  } else {
    goto CommandBegin;
  }
CommandPostWrapCopy:
  {
    int wrap_guard = s->ringbuffer_size - pos;
    while (--i >= 0) {
      s->ringbuffer[pos] =
          s->ringbuffer[(pos - s->distance_code) & s->ringbuffer_mask];
      ++pos;
      if (BROTLI_PREDICT_FALSE(--wrap_guard == 0)) {
        s->state = BROTLI_STATE_COMMAND_POST_WRITE_2;
        goto saveStateAndReturn;
      }
    }
  }
  if (s->meta_block_remaining_len <= 0) {
    /* Next metablock, if any. */
    s->state = BROTLI_STATE_METABLOCK_DONE;
    goto saveStateAndReturn;
  } else {
    goto CommandBegin;
  }

saveStateAndReturn:
  s->pos = pos;
  s->loop_counter = i;
  return result;
}